

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall Js::ProbeContainer::DispatchDOMMutationBreakpoint(ProbeContainer *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  ScriptContext *pSVar6;
  int *local_d0;
  InterpreterHaltState *local_c8;
  ProbeContainer *local_c0;
  undefined1 auStack_70 [8];
  InterpreterHaltState haltState;
  int local_1c [2];
  int currentOffset;
  
  InterpreterHaltState::InterpreterHaltState
            ((InterpreterHaltState *)auStack_70,STOP_DOMMUTATIONBREAKPOINT,(FunctionBody *)0x0,
             (MutationBreakpoint *)0x0);
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchDOMMutationBreakpoint: start: this=%p, pHaltState=%p\n",
                this);
  bVar2 = CanDispatchHalt(this,(InterpreterHaltState *)auStack_70);
  if (bVar2) {
    local_d0 = local_1c;
    local_1c[0] = -1;
    haltState.activeMutationBP = (MutationBreakpoint *)&local_d0;
    local_c8 = (InterpreterHaltState *)auStack_70;
    local_c0 = this;
    InitializeLocation(this,(InterpreterHaltState *)auStack_70,true);
    bVar2 = InterpreterHaltState::IsValid((InterpreterHaltState *)auStack_70);
    Output::Trace(DebuggerPhase,
                  L"ProbeContainer::DispatchDOMMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"
                  ,(ulong)bVar2);
    bVar2 = InterpreterHaltState::IsValid((InterpreterHaltState *)auStack_70);
    if (bVar2) {
      cVar3 = (**(code **)(*(long *)CONCAT44(haltState.executingFunction._4_4_,
                                             haltState.executingFunction._0_4_) + 0x60))();
      if (cVar3 != '\0') {
        local_1c[0] = InterpreterHaltState::GetCurrentOffset((InterpreterHaltState *)auStack_70);
        if (local_1c[0] < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,499,"(currentOffset > 0)","currentOffset > 0");
          if (!bVar2) goto LAB_007fd801;
          *puVar4 = 0;
        }
        InterpreterHaltState::SetCurrentOffset((InterpreterHaltState *)auStack_70,local_1c[0] + -1);
      }
      StepController::Deactivate
                (&this->debugManager->stepController,(InterpreterHaltState *)auStack_70);
      AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
      pFVar5 = InterpreterHaltState::GetFunction((InterpreterHaltState *)auStack_70);
      FunctionBody::CheckAndRegisterFuncToDiag(pFVar5,this->pScriptContext);
      pFVar5 = InterpreterHaltState::GetFunction((InterpreterHaltState *)auStack_70);
      pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar5);
      if (pSVar6 != this->pScriptContext) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                    ,0x1fb,
                                    "(haltState.GetFunction()->GetScriptContext() == pScriptContext)"
                                    ,"haltState.GetFunction()->GetScriptContext() == pScriptContext"
                                   );
        if (!bVar2) {
LAB_007fd801:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,auStack_70);
    }
    anon_func::FinallyObject::~FinallyObject((FinallyObject *)&haltState.activeMutationBP);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchDOMMutationBreakpoint()
    {
        InterpreterHaltState haltState(STOP_DOMMUTATIONBREAKPOINT, /*_executingFunction*/nullptr);
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchDOMMutationBreakpoint: start: this=%p, pHaltState=%p\n"), this, haltState);
        if (!CanDispatchHalt(&haltState))
        {
            return;
        }

        int currentOffset = -1;
        TryFinally([&]()
        {
            InitializeLocation(&haltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchDOMMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                haltState, haltState.IsValid());

            if (haltState.IsValid())
            {
                if (haltState.topFrame->IsInterpreterFrame())
                {
                    currentOffset = haltState.GetCurrentOffset();
                    Assert(currentOffset > 0);
                    haltState.SetCurrentOffset(currentOffset - 1);
                }
                debugManager->stepController.Deactivate(&haltState);
                debugManager->asyncBreakController.Deactivate();

                haltState.GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                Assert(haltState.GetFunction()->GetScriptContext() == pScriptContext);

                haltCallbackProbe->DispatchHalt(&haltState);
            }
        },
            [&](bool)
        {
            // Restore the current offset;
            if (currentOffset != -1 && haltState.topFrame->IsInterpreterFrame())
            {
                haltState.SetCurrentOffset(currentOffset);
            }
            DestroyLocation();
        });
    }